

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestReferenceCounting::initProgram(TextureViewTestReferenceCounting *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLint GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  GLint compile_status;
  char *varying_name;
  char *vs_body;
  GLint link_status;
  ostringstream local_1a0 [376];
  long lVar5;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x26c0);
  GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x26c3);
  vs_body = 
  "#version 400\n\nuniform vec4      expected_texel;\nuniform int       lod;\nuniform sampler2D sampler;\n\nout int has_passed;\n\nvoid main()\n{\n          vec4  data    = textureLod(sampler, vec2(0.5, 0.5), lod);\n    const float epsilon = 1.0 / 256.0;\n\n    if (abs(data.r - expected_texel.r) > epsilon ||\n        abs(data.g - expected_texel.g) > epsilon ||\n        abs(data.b - expected_texel.b) > epsilon ||\n        abs(data.a - expected_texel.a) > epsilon)\n    {\n        has_passed = 0;\n    }\n    else\n    {\n        has_passed = 1;\n    }\n}\n"
  ;
  (**(code **)(lVar5 + 0x12b8))(this->m_vs_id,1,&vs_body,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x26e1);
  varying_name = "has_passed";
  (**(code **)(lVar5 + 0x14c8))(this->m_po_id,1,&varying_name,0x8c8c);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glTransformFeedbackVaryings() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x26e7);
  (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_vs_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glAttachShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x26eb);
  (**(code **)(lVar5 + 0x248))(this->m_vs_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x26ef);
  compile_status = 0;
  (**(code **)(lVar5 + 0xa70))(this->m_vs_id,0x8b81,&compile_status);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x26f5);
  if (compile_status != 1) {
    _link_status = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"Shader compilation failed");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&link_status,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  (**(code **)(lVar5 + 0xce8))(this->m_po_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glLinkProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x26fe);
  _link_status = (TestLog *)((ulong)_link_status & 0xffffffff00000000);
  (**(code **)(lVar5 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2704);
  if (link_status == 1) {
    GVar4 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"expected_texel");
    this->m_po_expected_texel_uniform_location = GVar4;
    iVar1 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"lod");
    this->m_po_lod_uniform_location = iVar1;
    if (this->m_po_expected_texel_uniform_location == -1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"expected_texel is considered an inactive uniform which is invalid",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x2711);
    }
    else {
      if (iVar1 != -1) {
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"lod is considered an inactive uniform which is invalid",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x2716);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program linking failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x2708);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestReferenceCounting::initProgram()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program & shader object IDs */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

	/* Set vertex shader body */
	const char* vs_body = "#version 400\n"
						  "\n"
						  "uniform vec4      expected_texel;\n"
						  "uniform int       lod;\n"
						  "uniform sampler2D sampler;\n"
						  "\n"
						  "out int has_passed;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "          vec4  data    = textureLod(sampler, vec2(0.5, 0.5), lod);\n"
						  "    const float epsilon = 1.0 / 256.0;\n"
						  "\n"
						  "    if (abs(data.r - expected_texel.r) > epsilon ||\n"
						  "        abs(data.g - expected_texel.g) > epsilon ||\n"
						  "        abs(data.b - expected_texel.b) > epsilon ||\n"
						  "        abs(data.a - expected_texel.a) > epsilon)\n"
						  "    {\n"
						  "        has_passed = 0;\n"
						  "    }\n"
						  "    else\n"
						  "    {\n"
						  "        has_passed = 1;\n"
						  "    }\n"
						  "}\n";

	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body, NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

	/* Configure XFB */
	const char* varying_name = "has_passed";

	gl.transformFeedbackVaryings(m_po_id, 1 /* count */, &varying_name, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");

	/* Attach the shader object to the program */
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed");

	/* Compile the shader */
	gl.compileShader(m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	/* Make sure the compilation has succeeded */
	glw::GLint compile_status = GL_FALSE;

	gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status != GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Shader compilation failed" << tcu::TestLog::EndMessage;
	}

	/* Link the program object */
	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

	/* Make sure the program object has linked successfully */
	glw::GLint link_status = GL_FALSE;

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Retrieve uniform locations */
	m_po_expected_texel_uniform_location = gl.getUniformLocation(m_po_id, "expected_texel");
	m_po_lod_uniform_location			 = gl.getUniformLocation(m_po_id, "lod");

	if (m_po_expected_texel_uniform_location == -1)
	{
		TCU_FAIL("expected_texel is considered an inactive uniform which is invalid");
	}

	if (m_po_lod_uniform_location == -1)
	{
		TCU_FAIL("lod is considered an inactive uniform which is invalid");
	}
}